

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O0

State * __thiscall
chaiscript::ChaiScript_Basic::get_state(State *__return_storage_ptr__,ChaiScript_Basic *this)

{
  State local_100;
  undefined1 local_3d;
  undefined1 local_30 [8];
  shared_lock<chaiscript::detail::threading::shared_mutex> l2;
  lock_guard<chaiscript::detail::threading::recursive_mutex> l;
  ChaiScript_Basic *this_local;
  State *s;
  
  Catch::clara::std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)&l2._M_owns,&this->m_use_mutex);
  Catch::clara::std::shared_lock<std::shared_mutex>::shared_lock
            ((shared_lock<std::shared_mutex> *)local_30,&this->m_mutex);
  local_3d = 0;
  State::State(__return_storage_ptr__);
  Catch::clara::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->used_files,&this->m_used_files);
  detail::Dispatch_Engine::get_state(&local_100,&this->m_engine);
  detail::Dispatch_Engine::State::operator=(&__return_storage_ptr__->engine_state,&local_100);
  detail::Dispatch_Engine::State::~State(&local_100);
  Catch::clara::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->active_loaded_modules,&this->m_active_loaded_modules);
  local_3d = 1;
  Catch::clara::std::shared_lock<std::shared_mutex>::~shared_lock
            ((shared_lock<std::shared_mutex> *)local_30);
  Catch::clara::std::lock_guard<std::recursive_mutex>::~lock_guard
            ((lock_guard<std::recursive_mutex> *)&l2._M_owns);
  return __return_storage_ptr__;
}

Assistant:

State get_state() const {
      chaiscript::detail::threading::lock_guard<chaiscript::detail::threading::recursive_mutex> l(m_use_mutex);
      chaiscript::detail::threading::shared_lock<chaiscript::detail::threading::shared_mutex> l2(m_mutex);

      State s;
      s.used_files = m_used_files;
      s.engine_state = m_engine.get_state();
      s.active_loaded_modules = m_active_loaded_modules;
      return s;
    }